

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::DeepTiledOutputFile::~DeepTiledOutputFile(DeepTiledOutputFile *this)

{
  long *plVar1;
  undefined8 uVar2;
  GenericOutputFile *in_RDI;
  Data *unaff_retaddr;
  OStream *in_stack_00000018;
  TileOffsets *in_stack_00000020;
  uint64_t originalPosition;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  _func_int **pp_Var3;
  
  in_RDI->_vptr_GenericOutputFile = (_func_int **)&PTR__DeepTiledOutputFile_002ac300;
  if (in_RDI[1]._vptr_GenericOutputFile != (_func_int **)0x0) {
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    uVar2 = (**(code **)(**(long **)(in_RDI[1]._vptr_GenericOutputFile[0x38] + 0x28) + 0x18))();
    if (in_RDI[1]._vptr_GenericOutputFile[0x2a] != (_func_int *)0x0) {
      plVar1 = *(long **)(in_RDI[1]._vptr_GenericOutputFile[0x38] + 0x28);
      (**(code **)(*plVar1 + 0x20))(plVar1,in_RDI[1]._vptr_GenericOutputFile[0x2a]);
      TileOffsets::writeTo(in_stack_00000020,in_stack_00000018);
      (**(code **)(**(long **)(in_RDI[1]._vptr_GenericOutputFile[0x38] + 0x28) + 0x20))
                (*(long **)(in_RDI[1]._vptr_GenericOutputFile[0x38] + 0x28),uVar2);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1c3b8b);
    if (((((ulong)in_RDI[1]._vptr_GenericOutputFile[0x39] & 1) != 0) &&
        (in_RDI[1]._vptr_GenericOutputFile[0x38] != (_func_int *)0x0)) &&
       (*(long **)(in_RDI[1]._vptr_GenericOutputFile[0x38] + 0x28) != (long *)0x0)) {
      (**(code **)(**(long **)(in_RDI[1]._vptr_GenericOutputFile[0x38] + 0x28) + 8))();
    }
    if (((*(int *)(in_RDI[1]._vptr_GenericOutputFile + 0x33) == -1) &&
        (in_RDI[1]._vptr_GenericOutputFile[0x38] != (_func_int *)0x0)) &&
       (in_RDI[1]._vptr_GenericOutputFile[0x38] != (_func_int *)0x0)) {
      operator_delete(in_RDI[1]._vptr_GenericOutputFile[0x38],0x38);
    }
    pp_Var3 = in_RDI[1]._vptr_GenericOutputFile;
    if (pp_Var3 != (_func_int **)0x0) {
      Data::~Data(unaff_retaddr);
      operator_delete(pp_Var3,0x1d0);
    }
  }
  GenericOutputFile::~GenericOutputFile(in_RDI);
  return;
}

Assistant:

DeepTiledOutputFile::~DeepTiledOutputFile ()
{
    if (_data)
    {
        {
#if ILMTHREAD_THREADING_ENABLED
            std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
            uint64_t originalPosition = _data->_streamData->os->tellp ();

            if (_data->tileOffsetsPosition > 0)
            {
                try
                {
                    _data->_streamData->os->seekp (_data->tileOffsetsPosition);
                    _data->tileOffsets.writeTo (*_data->_streamData->os);

                    //
                    // Restore the original position.
                    //
                    _data->_streamData->os->seekp (originalPosition);
                }
                catch (
                    ...) //NOSONAR - suppress vulnerability reports from SonarCloud.
                {
                    //
                    // We cannot safely throw any exceptions from here.
                    // This destructor may have been called because the
                    // stack is currently being unwound for another
                    // exception.
                    //
                }
            }
        }

        if (_data->_deleteStream && _data->_streamData)
            delete _data->_streamData->os;

        //
        // (TODO) we should have a way to tell if the stream data is owned by
        // this file or by a parent multipart file.
        //

        if (_data->partNumber == -1 && _data->_streamData)
            delete _data->_streamData;

        delete _data;
    }
}